

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O1

int reconstructSeeds(tree_t *tree,uint16_t *hideList,size_t hideListSize,uint8_t *input,
                    size_t inputLen,uint8_t *salt,uint repIndex,picnic_instance_t *params)

{
  uint uVar1;
  size_t sVar2;
  uint *__ptr;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  size_t local_38;
  
  local_38 = 0;
  __ptr = getRevealedNodes(tree,hideList,hideListSize,&local_38);
  sVar2 = local_38;
  iVar4 = -1;
  if (__ptr != (uint *)0x0) {
    uVar3 = params->seed_size * local_38;
    if (uVar3 < inputLen || uVar3 - inputLen == 0) {
      if (local_38 != 0) {
        sVar5 = 0;
        do {
          uVar1 = __ptr[sVar5];
          memcpy(tree->nodes + params->seed_size * uVar1,input,(ulong)params->seed_size);
          uVar1 = uVar1 * 2;
          tree->haveNodeExists[uVar1 >> 6] =
               tree->haveNodeExists[uVar1 >> 6] | 1L << ((ulong)(uVar1 + 1) & 0x3f);
          input = input + params->seed_size;
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
      }
      expandSeeds(tree,salt,repIndex,params);
      iVar4 = 0;
    }
  }
  free(__ptr);
  return iVar4;
}

Assistant:

int reconstructSeeds(tree_t* tree, uint16_t* hideList, size_t hideListSize, uint8_t* input,
                     size_t inputLen, uint8_t* salt, unsigned int repIndex,
                     const picnic_instance_t* params) {
  int ret                = -1;
  size_t revealedSize    = 0;
  unsigned int* revealed = getRevealedNodes(tree, hideList, hideListSize, &revealedSize);
  if (!revealed || inputLen < revealedSize * params->seed_size) {
    goto Exit;
  }

  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(&tree->nodes[revealed[i] * params->seed_size], input, params->seed_size);
    markNode(tree, revealed[i]);
    input += params->seed_size;
  }

  expandSeeds(tree, salt, repIndex, params);
  ret = 0;

Exit:
  free(revealed);
  return ret;
}